

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

Instr * __thiscall Inline::DoCheckThisOpt(Inline *this,Instr *instr)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ThisInfo TVar6;
  JITTimeFunctionBody *pJVar7;
  FunctionJITTimeInfo *pFVar8;
  undefined4 *puVar9;
  BailOutInstrTemplate<IR::Instr> *this_00;
  Opnd *this_01;
  Instr *pIVar10;
  JITTimeProfileInfo *pJVar11;
  
  pIVar10 = instr->m_next;
  pJVar7 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->topFunc->m_workItem);
  uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar7);
  pFVar8 = JITTimeWorkItem::GetJITTimeInfo(instr->m_func->topFunc->m_workItem);
  uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar8);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,CheckThisPhase,uVar4,uVar5);
  if (bVar2) {
    return pIVar10;
  }
  pJVar7 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->topFunc->m_workItem);
  uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar7);
  pFVar8 = JITTimeWorkItem::GetJITTimeInfo(instr->m_func->topFunc->m_workItem);
  uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar8);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,CheckThisPhase,uVar4,uVar5);
  if (!bVar2) {
    pJVar7 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
    bVar2 = JITTimeFunctionBody::HasProfileInfo(pJVar7);
    if (!bVar2) {
      return pIVar10;
    }
    pJVar7 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
    pJVar11 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar7);
    TVar6 = JITTimeProfileInfo::GetThisInfo(pJVar11);
    if (((uint)TVar6 & 0xff0000) != 0x10000) {
      return pIVar10;
    }
    pJVar7 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
    pJVar11 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar7);
    bVar2 = JITTimeProfileInfo::IsCheckThisDisabled(pJVar11);
    if (bVar2) {
      return pIVar10;
    }
  }
  if (instr->m_opcode != LdThis) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1609,"(instr->m_opcode == Js::OpCode::LdThis)",
                       "instr->m_opcode == Js::OpCode::LdThis");
    if (!bVar2) goto LAB_00557df1;
    *puVar9 = 0;
  }
  if (instr->m_func->parentFunc == (Func *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x160a,"(instr->IsInlined())","instr->IsInlined()");
    if (!bVar2) goto LAB_00557df1;
    *puVar9 = 0;
  }
  if (instr->m_opcode == LdThis) {
    IR::Instr::FreeSrc2(instr);
  }
  this_00 = IR::BailOutInstrTemplate<IR::Instr>::New(CheckThis,BailOutCheckThis,instr,instr->m_func)
  ;
  this_01 = instr->m_src1;
  if ((this_00->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_00557df1;
    *puVar9 = 0;
  }
  func = (this_00->super_Instr).m_func;
  if (this_01->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) {
LAB_00557df1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar9 = 0;
  }
  bVar3 = this_01->field_0xb;
  if ((bVar3 & 2) != 0) {
    this_01 = IR::Opnd::Copy(this_01,func);
    bVar3 = this_01->field_0xb;
  }
  this_01->field_0xb = bVar3 | 2;
  (this_00->super_Instr).m_src1 = this_01;
  IR::Instr::SetByteCodeOffset(&this_00->super_Instr,instr);
  pIVar10 = instr;
  IR::Instr::InsertBefore(instr,&this_00->super_Instr);
  pIVar10 = RemoveLdThis((Inline *)pIVar10,instr);
  return pIVar10;
}

Assistant:

IR::Instr *
Inline::DoCheckThisOpt(IR::Instr * instr)
{
    IR::Instr * instrNext = instr->m_next;

    if (PHASE_OFF(Js::CheckThisPhase, instr->m_func->GetTopFunc()))
    {
        return instrNext;
    }

    if (!PHASE_FORCE(Js::CheckThisPhase, instr->m_func->GetTopFunc()))
    {
        if (!instr->m_func->HasProfileInfo())
        {
            return instrNext;
        }

        if (instr->m_func->GetReadOnlyProfileInfo()->GetThisInfo().thisType != Js::ThisType_Simple)
        {
            return instrNext;
        }

        if (instr->m_func->GetReadOnlyProfileInfo()->IsCheckThisDisabled())
        {
            return instrNext;
        }
    }

    // If the instr is an inlined LdThis, try to replace it with a CheckThis
    // that will bail out if a helper call is required to get the real "this" pointer.

    Assert(instr->m_opcode == Js::OpCode::LdThis);
    Assert(instr->IsInlined());

    // Create the CheckThis. The target is the original offset, i.e., the LdThis still has to be executed.
    if(instr->m_opcode == Js::OpCode::LdThis)
    {
        instr->FreeSrc2();
    }
    IR::Instr *newInstr =
        IR::BailOutInstr::New(Js::OpCode::CheckThis, IR::BailOutCheckThis, instr, instr->m_func);
    // Just re-use the original src1 since the LdThis will usually be deleted.
    newInstr->SetSrc1(instr->GetSrc1());
    newInstr->SetByteCodeOffset(instr);
    instr->InsertBefore(newInstr);

    return this->RemoveLdThis(instr);
}